

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (CompilerGLSL *this,TextureFunctionArguments *args,bool *p_forward)

{
  undefined8 type_00;
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  SPIRType *pSVar4;
  char *pcVar5;
  CompilerError *this_00;
  char in_RCX [8];
  BaseType target_type;
  bool local_927;
  bool local_924;
  bool local_922;
  bool local_920;
  bool local_91e;
  bool local_91c;
  bool local_91a;
  bool local_8fa;
  byte local_8e9;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [64];
  undefined1 local_720 [32];
  undefined1 local_700 [64];
  spirv_cross local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [64];
  undefined1 local_640 [32];
  undefined1 local_620 [64];
  undefined1 local_5e0 [64];
  undefined1 local_5a0 [40];
  SPIRType type;
  string local_428 [32];
  undefined1 local_408 [64];
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [64];
  undefined1 local_368 [64];
  undefined1 local_328 [32];
  undefined1 local_308 [64];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [40];
  undefined1 local_280 [7];
  bool workaround_lod_array_shadow_as_grad;
  undefined1 local_260 [8];
  SPIRType expected_type;
  SPIRType *coord_type;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  char *swizzle_expr;
  spirv_cross local_b0 [5];
  bool forward;
  anon_class_1_1_ecf36ffc swizzle;
  bool swizz_func;
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  SPIRType *imgtype;
  AlignedBuffer<unsigned_char,_8UL> AStack_28;
  VariableID img;
  bool *p_forward_local;
  TextureFunctionArguments *args_local;
  CompilerGLSL *this_local;
  string *farg_str;
  
  imgtype._4_4_ = *(undefined4 *)p_forward;
  local_60._40_8_ = *(undefined8 *)(p_forward + 8);
  local_60[0x27] = '\0';
  AStack_28.aligned_char = in_RCX;
  ::std::__cxx11::string::string((string *)this);
  target_type = (BaseType)args;
  if ((p_forward[0x10] & 1U) == 0) {
    TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    to_non_uniform_aware_expression_abi_cxx11_((CompilerGLSL *)local_90,target_type);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_90);
    ::std::__cxx11::string::~string((string *)local_90);
  }
  else {
    TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    convert_separate_image_to_expression_abi_cxx11_((CompilerGLSL *)local_60,target_type);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
  }
  if (((p_forward[0x4c] & 1U) != 0) &&
     (lVar3 = ::std::__cxx11::string::find_first_of((char)this,0x5b), lVar3 != -1)) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (local_b0,(char **)&args[0x68].grad_y,(char (*) [2])0x5cba12,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char (*) [2])0x5b48c4);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_b0);
    ::std::__cxx11::string::~string((string *)local_b0);
  }
  swizzle_expr._6_1_ = (byte)args[0x68].bias & 1;
  swizzle_expr._7_1_ = swizzle_expr._6_1_;
  swizzle_expr._5_1_ = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x18));
  uVar2 = *(uint32_t *)(p_forward + 0x1c);
  pSVar4 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x18));
  pcVar5 = to_function_args::anon_class_1_1_ecf36ffc::operator()
                     ((anon_class_1_1_ecf36ffc *)((long)&swizzle_expr + 6),uVar2,pSVar4->vecsize);
  if (*pcVar5 == '\0') {
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_e0,target_type,SUB41(*(undefined4 *)(p_forward + 0x18),0));
  }
  else {
    to_enclosed_expression_abi_cxx11_
              ((CompilerGLSL *)local_100,target_type,SUB41(*(undefined4 *)(p_forward + 0x18),0));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     local_100);
    ::std::__cxx11::string::~string((string *)local_100);
  }
  expected_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x18));
  if (*(int *)&(((SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket)->super_IVariant)
               .field_0xc == 8) {
    SPIRType::SPIRType((SPIRType *)local_260,
                       (SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
    expected_type.super_IVariant._12_1_ = p_forward[0x1c];
    expected_type.super_IVariant._13_1_ = p_forward[0x1d];
    expected_type.super_IVariant._14_1_ = p_forward[0x1e];
    expected_type.super_IVariant._15_1_ = p_forward[0x1f];
    expected_type.super_IVariant._vptr_IVariant._4_4_ = 7;
    bitcast_expression((CompilerGLSL *)local_280,(SPIRType *)args,(BaseType)local_260,
                       (string *)
                       (ulong)*(uint *)((long)&expected_type.member_name_cache._M_h._M_single_bucket
                                               [1]._M_nxt + 4));
    ::std::__cxx11::string::operator=((string *)local_e0,(string *)local_280);
    ::std::__cxx11::string::~string((string *)local_280);
    SPIRType::~SPIRType((SPIRType *)local_260);
  }
  type_00 = local_60._40_8_;
  if ((((((bool *)(local_60._40_8_ + 0x100))[1] & 1U) != 0) &&
      (((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim2D)) ||
     (local_8e9 = 0, ((ImageType *)(local_60._40_8_ + 0xf8))->dim == DimCube)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    bVar1 = Compiler::is_depth_image((Compiler *)args,(SPIRType *)type_00,uVar2);
    local_8e9 = 0;
    if ((bVar1) && (local_8e9 = 0, *(int *)(p_forward + 0x2c) != 0)) {
      local_8e9 = p_forward[0x10] ^ 0xff;
    }
  }
  local_2a8[0x27] = local_8e9 & 1;
  if (*(int *)(p_forward + 0x20) == 0) {
    if ((((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim1D) && ((args[0x5f].grad_y & 1) != 0)) {
      bVar1 = type_is_floating_point
                        ((SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
      if (bVar1) {
        if (((((bool *)(local_60._40_8_ + 0x100))[1] & 1U) == 0) && ((p_forward[0x12] & 1U) == 0)) {
          join<char_const(&)[6],std::__cxx11::string&,char_const(&)[7]>
                    (local_6c0,(char (*) [6])0x5b3375,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (char (*) [7])", 0.0)");
          ::std::__cxx11::string::operator=((string *)local_e0,(string *)local_6c0);
          ::std::__cxx11::string::~string((string *)local_6c0);
        }
        else {
          enclose_expression((CompilerGLSL *)local_680,(string *)args);
          enclose_expression((CompilerGLSL *)local_6a0,(string *)args);
          join<char_const(&)[6],std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[4]>
                    ((spirv_cross *)(local_680 + 0x20),(char (*) [6])0x5b15e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680,
                     (char (*) [10])".x, 0.0, ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0,
                     (char (*) [4])0x5b906a);
          ::std::__cxx11::string::operator=((string *)local_e0,(string *)(local_680 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_680 + 0x20));
          ::std::__cxx11::string::~string((string *)local_6a0);
          ::std::__cxx11::string::~string((string *)local_680);
        }
      }
      else if ((((bool *)(local_60._40_8_ + 0x100))[1] & 1U) == 0) {
        join<char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                  ((spirv_cross *)(local_760 + 0x20),(char (*) [7])"ivec2(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (char (*) [5])0x5b3775);
        ::std::__cxx11::string::operator=((string *)local_e0,(string *)(local_760 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_760 + 0x20));
      }
      else {
        enclose_expression((CompilerGLSL *)local_700,(string *)args);
        enclose_expression((CompilerGLSL *)local_720,(string *)args);
        join<char_const(&)[7],std::__cxx11::string,char_const(&)[8],std::__cxx11::string,char_const(&)[4]>
                  ((spirv_cross *)(local_700 + 0x20),(char (*) [7])"ivec3(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                   (char (*) [8])".x, 0, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720,
                   (char (*) [4])0x5b906a);
        ::std::__cxx11::string::operator=((string *)local_e0,(string *)(local_700 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_700 + 0x20));
        ::std::__cxx11::string::~string((string *)local_720);
        ::std::__cxx11::string::~string((string *)local_700);
      }
    }
    ::std::__cxx11::string::operator+=((string *)this,", ");
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_e0);
  }
  else {
    local_8fa = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_8fa = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x20));
    }
    swizzle_expr._5_1_ = local_8fa;
    if (((p_forward[0x11] & 1U) == 0) && (*(int *)(p_forward + 0x1c) != 4)) {
      if ((p_forward[0x12] & 1U) == 0) {
        pSVar4 = Compiler::expression_type((Compiler *)args,*(uint32_t *)(p_forward + 0x18));
        SPIRType::SPIRType((SPIRType *)(local_5a0 + 0x20),pSVar4);
        type.super_IVariant._12_4_ = *(int *)(p_forward + 0x1c) + 1;
        if ((((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim1D) &&
           ((args[0x5f].grad_y & 1) != 0)) {
          type.super_IVariant._12_4_ = *(int *)(p_forward + 0x1c) + 2;
        }
        ::std::__cxx11::string::operator+=((string *)this,", ");
        type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_5a0,(SPIRType *)args);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_5a0);
        ::std::__cxx11::string::~string((string *)local_5a0);
        ::std::__cxx11::string::operator+=((string *)this,"(");
        if ((((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim1D) &&
           ((args[0x5f].grad_y & 1) != 0)) {
          if ((((bool *)(local_60._40_8_ + 0x100))[1] & 1U) == 0) {
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_e0);
            ::std::__cxx11::string::operator+=((string *)this,", 0.0");
          }
          else {
            enclose_expression((CompilerGLSL *)local_5e0,(string *)args);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_5e0 + 0x20),local_5e0);
            ::std::__cxx11::string::operator+=((string *)this,(string *)(local_5e0 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_5e0 + 0x20));
            ::std::__cxx11::string::~string((string *)local_5e0);
            ::std::__cxx11::string::operator+=((string *)this,", 0.0, ");
            enclose_expression((CompilerGLSL *)local_620,(string *)args);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_620 + 0x20),local_620);
            ::std::__cxx11::string::operator+=((string *)this,(string *)(local_620 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_620 + 0x20));
            ::std::__cxx11::string::~string((string *)local_620);
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_e0);
        }
        ::std::__cxx11::string::operator+=((string *)this,", ");
        to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_640,target_type,SUB41(*(undefined4 *)(p_forward + 0x20),0))
        ;
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_640);
        ::std::__cxx11::string::~string((string *)local_640);
        ::std::__cxx11::string::operator+=((string *)this,")");
        SPIRType::~SPIRType((SPIRType *)(local_5a0 + 0x20));
      }
      else {
        ::std::__cxx11::string::operator+=((string *)this,", vec4(");
        if (((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim1D) {
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_308,target_type,
                     SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_308 + 0x20),local_308);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_308 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_308 + 0x20));
          ::std::__cxx11::string::~string((string *)local_308);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          ::std::__cxx11::string::operator+=((string *)this,"0.0, ");
          to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_328,target_type,
                     SUB41(*(undefined4 *)(p_forward + 0x20),0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_328);
          ::std::__cxx11::string::~string((string *)local_328);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_368,target_type,
                     SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_368 + 0x20),local_368);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_368 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_368 + 0x20));
          ::std::__cxx11::string::~string((string *)local_368);
        }
        else {
          if (((ImageType *)(local_60._40_8_ + 0xf8))->dim != Dim2D) {
            type.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_428,"Invalid type for textureProj with shadow.",
                       (allocator *)((long)&type.member_name_cache._M_h._M_single_bucket + 7));
            CompilerError::CompilerError(this_00,(string *)local_428);
            type.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_3a8,target_type,
                     SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_3a8 + 0x20),local_3a8);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_3a8 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
          ::std::__cxx11::string::~string((string *)local_3a8);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_3c8,target_type,
                     SUB41(*(undefined4 *)(p_forward + 0x20),0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3c8);
          ::std::__cxx11::string::~string((string *)local_3c8);
          ::std::__cxx11::string::operator+=((string *)this,", ");
          to_enclosed_expression_abi_cxx11_
                    ((CompilerGLSL *)local_408,target_type,
                     SUB41(*(undefined4 *)(p_forward + 0x18),0));
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_408 + 0x20),local_408);
          ::std::__cxx11::string::operator+=((string *)this,(string *)(local_408 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_408 + 0x20));
          ::std::__cxx11::string::~string((string *)local_408);
        }
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)this,", ");
      to_expression_abi_cxx11_
                ((CompilerGLSL *)local_2a8,target_type,SUB41(*(undefined4 *)(p_forward + 0x18),0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_2a8);
      ::std::__cxx11::string::~string((string *)local_2a8);
      ::std::__cxx11::string::operator+=((string *)this,", ");
      to_expression_abi_cxx11_
                ((CompilerGLSL *)local_2c8,target_type,SUB41(*(undefined4 *)(p_forward + 0x20),0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_2c8);
      ::std::__cxx11::string::~string((string *)local_2c8);
    }
  }
  if ((*(int *)(p_forward + 0x24) != 0) || (*(int *)(p_forward + 0x28) != 0)) {
    local_91a = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_91a = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x24));
    }
    swizzle_expr._5_1_ = local_91a;
    local_91c = false;
    if (local_91a != false) {
      local_91c = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x28));
    }
    swizzle_expr._5_1_ = local_91c;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_760,target_type,SUB41(*(undefined4 *)(p_forward + 0x24),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_760);
    ::std::__cxx11::string::~string((string *)local_760);
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_780,target_type,SUB41(*(undefined4 *)(p_forward + 0x28),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_780);
    ::std::__cxx11::string::~string((string *)local_780);
  }
  if (*(int *)(p_forward + 0x2c) == 0) {
    if ((((p_forward[0x10] & 1U) != 0) &&
        (((ImageType *)(local_60._40_8_ + 0xf8))->dim != DimBuffer)) &&
       ((((bool *)(local_60._40_8_ + 0x100))[2] & 1U) == 0)) {
      ::std::__cxx11::string::operator+=((string *)this,", 0");
    }
  }
  else if ((local_2a8[0x27] & 1) == 0) {
    local_91e = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_91e = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x2c));
    }
    swizzle_expr._5_1_ = local_91e;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    if ((((p_forward[0x10] & 1U) == 0) ||
        (((ImageType *)(local_60._40_8_ + 0xf8))->dim == DimBuffer)) ||
       ((((bool *)(local_60._40_8_ + 0x100))[2] & 1U) != 0)) {
      to_expression_abi_cxx11_
                ((CompilerGLSL *)local_7c0,target_type,SUB41(*(undefined4 *)(p_forward + 0x2c),0));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_7c0);
      ::std::__cxx11::string::~string((string *)local_7c0);
    }
    else {
      bitcast_expression_abi_cxx11_((CompilerGLSL *)local_7a0,target_type,7);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_7a0);
      ::std::__cxx11::string::~string((string *)local_7a0);
    }
  }
  else if (((ImageType *)(local_60._40_8_ + 0xf8))->dim == Dim2D) {
    ::std::__cxx11::string::operator+=((string *)this,", vec2(0.0), vec2(0.0)");
  }
  else if (((ImageType *)(local_60._40_8_ + 0xf8))->dim == DimCube) {
    ::std::__cxx11::string::operator+=((string *)this,", vec3(0.0), vec3(0.0)");
  }
  if (*(int *)(p_forward + 0x30) == 0) {
    if (*(int *)(p_forward + 0x34) != 0) {
      local_922 = false;
      if ((swizzle_expr._5_1_ & 1) != 0) {
        local_922 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x34));
      }
      swizzle_expr._5_1_ = local_922;
      ::std::__cxx11::string::operator+=((string *)this,", ");
      bitcast_expression_abi_cxx11_((CompilerGLSL *)local_800,target_type,7);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_800);
      ::std::__cxx11::string::~string((string *)local_800);
    }
  }
  else {
    local_920 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_920 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x30));
    }
    swizzle_expr._5_1_ = local_920;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    bitcast_expression_abi_cxx11_((CompilerGLSL *)local_7e0,target_type,7);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_7e0);
    ::std::__cxx11::string::~string((string *)local_7e0);
  }
  if (*(int *)(p_forward + 0x40) != 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
    bitcast_expression_abi_cxx11_((CompilerGLSL *)local_820,target_type,7);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_820);
    ::std::__cxx11::string::~string((string *)local_820);
  }
  if (*(int *)(p_forward + 0x48) != 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_840,target_type,SUB41(*(undefined4 *)(p_forward + 0x48),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_840);
    ::std::__cxx11::string::~string((string *)local_840);
  }
  if (*(int *)(p_forward + 0x44) != 0) {
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_860,target_type,SUB41(*(undefined4 *)(p_forward + 0x44),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_860);
    ::std::__cxx11::string::~string((string *)local_860);
  }
  if (*(int *)(p_forward + 0x38) != 0) {
    local_924 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_924 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x38));
    }
    swizzle_expr._5_1_ = local_924;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    to_expression_abi_cxx11_
              ((CompilerGLSL *)local_880,target_type,SUB41(*(undefined4 *)(p_forward + 0x38),0));
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_880);
    ::std::__cxx11::string::~string((string *)local_880);
  }
  if ((*(int *)(p_forward + 0x3c) != 0) &&
     (bVar1 = expression_is_constant_null((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x3c)),
     !bVar1)) {
    local_927 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_927 = should_forward((CompilerGLSL *)args,*(uint32_t *)(p_forward + 0x3c));
    }
    swizzle_expr._5_1_ = local_927;
    ::std::__cxx11::string::operator+=((string *)this,", ");
    bitcast_expression_abi_cxx11_((CompilerGLSL *)local_8a0,target_type,7);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_8a0);
    ::std::__cxx11::string::~string((string *)local_8a0);
  }
  *(byte *)AStack_28.aligned_char = swizzle_expr._5_1_ & 1;
  local_60[0x27] = 1;
  ::std::__cxx11::string::~string((string *)local_e0);
  if ((local_60[0x27] & 1) == 0) {
    ::std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_non_uniform_aware_expression(img);

	if (args.nonuniform_expression && farg_str.find_first_of('[') != string::npos)
	{
		// Only emit nonuniformEXT() wrapper if the underlying expression is arrayed in some way.
		farg_str = join(backend.nonuniform_qualifier, "(", farg_str, ")");
	}

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, img) && args.lod != 0 && !args.base.is_fetch;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			if (imgtype.image.dim == Dim1D && options.es)
				type.vecsize++;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";

			if (imgtype.image.dim == Dim1D && options.es)
			{
				if (imgtype.image.arrayed)
				{
					farg_str += enclose_expression(coord_expr) + ".x";
					farg_str += ", 0.0, ";
					farg_str += enclose_expression(coord_expr) + ".y";
				}
				else
				{
					farg_str += coord_expr;
					farg_str += ", 0.0";
				}
			}
			else
				farg_str += coord_expr;

			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		if (imgtype.image.dim == Dim1D && options.es)
		{
			// Have to fake a second coordinate.
			if (type_is_floating_point(coord_type))
			{
				// Cannot mix proj and array.
				if (imgtype.image.arrayed || args.base.is_proj)
				{
					coord_expr = join("vec3(", enclose_expression(coord_expr), ".x, 0.0, ",
					                  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("vec2(", coord_expr, ", 0.0)");
			}
			else
			{
				if (imgtype.image.arrayed)
				{
					coord_expr = join("ivec3(", enclose_expression(coord_expr),
									  ".x, 0, ",
									  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("ivec2(", coord_expr, ", 0)");
			}
		}

		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			forward = forward && should_forward(args.lod);
			farg_str += ", ";

			// Lod expression for TexelFetch in GLSL must be int, and only int.
			if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
				farg_str += bitcast_expression(SPIRType::Int, args.lod);
			else
				farg_str += to_expression(args.lod);
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.coffset)
	{
		forward = forward && should_forward(args.coffset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.coffset);
	}
	else if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component && !expression_is_constant_null(args.component))
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.component);
	}

	*p_forward = forward;

	return farg_str;
}